

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void CoreML::writeFeatureDescription(stringstream *ss,FeatureDescription *feature)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  FeatureType *wrapped;
  FeatureType local_50;
  string local_40;
  
  poVar3 = (ostream *)(ss + 0x10);
  poVar2 = std::operator<<(poVar3,"\t\t");
  poVar2 = std::operator<<(poVar2,(string *)(feature->name_).ptr_);
  poVar2 = std::operator<<(poVar2," (");
  wrapped = feature->type_;
  if (wrapped == (FeatureType *)0x0) {
    wrapped = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  FeatureType::FeatureType(&local_50,wrapped);
  FeatureType::toString_abi_cxx11_(&local_40,&local_50);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m_type.
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = std::operator!=((feature->shortdescription_).ptr_,"");
  if (bVar1) {
    poVar2 = std::operator<<(poVar3,": ");
    std::operator<<(poVar2,(string *)(feature->shortdescription_).ptr_);
  }
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

static void writeFeatureDescription(std::stringstream& ss,
                                        const Specification::FeatureDescription& feature) {
        ss  << "\t\t"
            << feature.name()
            << " ("
            << FeatureType(feature.type()).toString()
            << ")";
        if (feature.shortdescription() != "") {
            ss << ": " << feature.shortdescription();
        }
        ss << "\n";
    }